

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

RPCHelpMan * wallet::getaddressinfo(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_28;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffe258;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffe25c;
  undefined8 in_stack_ffffffffffffe260;
  undefined8 in_stack_ffffffffffffe268;
  undefined8 in_stack_ffffffffffffe270;
  _Manager_type in_stack_ffffffffffffe278;
  undefined8 in_stack_ffffffffffffe280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe288;
  pointer in_stack_ffffffffffffe298;
  pointer pRVar19;
  pointer in_stack_ffffffffffffe2a0;
  pointer pRVar20;
  pointer in_stack_ffffffffffffe2a8;
  pointer pRVar21;
  _Vector_impl_data in_stack_ffffffffffffe2b0;
  undefined1 in_stack_ffffffffffffe2c8 [16];
  pointer in_stack_ffffffffffffe2d8;
  pointer pRVar22;
  pointer in_stack_ffffffffffffe2e0;
  pointer pRVar23;
  pointer in_stack_ffffffffffffe2e8;
  pointer pRVar24;
  undefined8 in_stack_ffffffffffffe2f0;
  pointer in_stack_ffffffffffffe2f8;
  pointer pRVar25;
  pointer in_stack_ffffffffffffe300;
  pointer pRVar26;
  pointer in_stack_ffffffffffffe308;
  undefined8 in_stack_ffffffffffffe310;
  pointer in_stack_ffffffffffffe318;
  pointer in_stack_ffffffffffffe320;
  pointer in_stack_ffffffffffffe328;
  undefined8 in_stack_ffffffffffffe330;
  pointer in_stack_ffffffffffffe338;
  allocator<char> local_1ca9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ca8;
  allocator<char> local_1c8b;
  allocator<char> local_1c8a;
  allocator_type local_1c89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c88;
  allocator<char> local_1c6a;
  allocator<char> local_1c69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c68;
  allocator<char> local_1c4a;
  allocator<char> local_1c49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c48;
  allocator<char> local_1c2a;
  allocator<char> local_1c29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c28;
  allocator<char> local_1c0b;
  allocator<char> local_1c0a;
  allocator_type local_1c09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c08;
  allocator<char> local_1bea;
  allocator<char> local_1be9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1be8;
  allocator<char> local_1bca;
  allocator<char> local_1bc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1bc8;
  allocator<char> local_1baa;
  allocator<char> local_1ba9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ba8;
  allocator<char> local_1b8a;
  allocator<char> local_1b89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b88;
  allocator<char> local_1b6a;
  allocator<char> local_1b69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b68;
  allocator<char> local_1b4a;
  allocator<char> local_1b49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b48;
  allocator<char> local_1b2a;
  allocator<char> local_1b29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b28;
  allocator<char> local_1b0a;
  allocator<char> local_1b09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b08;
  allocator<char> local_1aea;
  allocator<char> local_1ae9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ae8;
  allocator<char> local_1aca;
  allocator<char> local_1ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ac8;
  allocator<char> local_1aaa;
  allocator<char> local_1aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1aa8;
  allocator<char> local_1a8a;
  allocator<char> local_1a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a88;
  allocator<char> local_1a6a;
  allocator<char> local_1a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a68;
  allocator<char> local_1a4a;
  allocator<char> local_1a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a48;
  allocator<char> local_1a2a;
  allocator<char> local_1a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a28;
  allocator<char> local_1a02;
  allocator<char> local_1a01;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a00;
  allocator<char> local_19e2;
  allocator<char> local_19e1;
  RPCResults local_19e0;
  allocator_type local_19c3;
  allocator<char> local_19c2;
  allocator<char> local_19c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_19c0;
  allocator<char> local_19a2;
  allocator<char> local_19a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1980;
  string local_1960;
  string local_1940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  string local_18e0;
  string local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  char *local_1880;
  size_type local_1878;
  char local_1870 [8];
  undefined8 uStack_1868;
  string local_1860 [32];
  string local_1840 [32];
  RPCResult local_1820;
  string local_1798 [32];
  string local_1778 [32];
  string local_1758 [32];
  string local_1738 [32];
  string local_1718 [32];
  string local_16f8 [32];
  string local_16d8 [32];
  string local_16b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  string local_1658 [32];
  string local_1638 [32];
  string local_1618 [32];
  string local_15f8 [32];
  string local_15d8 [32];
  RPCResult local_15b8;
  string local_1530 [32];
  string local_1510 [32];
  string local_14f0 [32];
  string local_14d0 [32];
  string local_14b0 [32];
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  RPCResult local_1430;
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  undefined8 local_1028 [4];
  string local_1008 [32];
  RPCResult local_fe8 [4];
  RPCResult local_dc8;
  RPCResult local_d40;
  RPCResult local_cb8;
  RPCResult local_c30;
  RPCResult local_ba8;
  RPCResult local_b20;
  RPCResult local_a98;
  RPCResult local_a10;
  RPCResult local_988;
  RPCResult local_900;
  RPCResult local_878;
  RPCResult local_7f0;
  RPCResult local_768;
  RPCResult local_6e0;
  RPCResult local_658;
  RPCResult local_5d0;
  RPCResult local_548;
  RPCResult local_4c0;
  RPCResult local_438;
  RPCResult local_3b0;
  string local_328 [32];
  string local_308 [32];
  RPCResult local_2e8;
  RPCArgOptions local_260;
  string local_218 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  undefined1 local_1a0;
  string local_198 [32];
  RPCArg local_178;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_1028[0] = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getaddressinfo",&local_19a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nReturn information about the given bitcoin address.\nSome of the information will only be present if the address is in the active wallet.\n"
             ,&local_19a2);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"address",&local_19c1);
  local_1f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"The bitcoin address for which to get information.",&local_19c2);
  local_260.oneline_description._M_dataplus._M_p = (pointer)&local_260.oneline_description.field_2;
  local_260.skip_type_check = false;
  local_260.oneline_description._M_string_length = 0;
  local_260.oneline_description.field_2._M_local_buf[0] = '\0';
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_260._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  name._M_string_length = in_stack_ffffffffffffe260;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  name.field_2._8_8_ = in_stack_ffffffffffffe270;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe280;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe278;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe288;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe298;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe2a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe2a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe2b0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe2b0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe2b0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe2c8;
  description_28._M_string_length = (size_type)in_stack_ffffffffffffe2e0;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2d8;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe2e8;
  description_28.field_2._8_8_ = in_stack_ffffffffffffe2f0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe300;
  opts._0_8_ = in_stack_ffffffffffffe2f8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe308;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe310;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe318;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe320;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe328;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe330;
  opts._64_8_ = in_stack_ffffffffffffe338;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_28,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_19c0,__l,&local_19c3);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"",&local_19e1);
  std::__cxx11::string::string<std::allocator<char>>(local_328,"",&local_19e2);
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"address",&local_1a01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1028,"The bitcoin address validated.",&local_1a02);
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  m_key_name._M_string_length = in_stack_ffffffffffffe260;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe270;
  description._M_string_length = in_stack_ffffffffffffe280;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description.field_2 = in_stack_ffffffffffffe288;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffe2a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffe298;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(local_fe8,STR,m_key_name,description,inner,SUB81(local_1008,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1048,"scriptPubKey",&local_1a29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1068,"The hex-encoded output script generated by the address.",&local_1a2a);
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_00._M_string_length = in_stack_ffffffffffffe280;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_00.field_2 = in_stack_ffffffffffffe288;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (local_fe8 + 1,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(local_1048,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1088,"ismine",&local_1a49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10a8,"If the address is yours.",&local_1a4a);
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_01._M_string_length = in_stack_ffffffffffffe280;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_01.field_2 = in_stack_ffffffffffffe288;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(local_fe8 + 2,BOOL,m_key_name_01,description_01,inner_01,SUB81(local_1088,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_10c8,"iswatchonly",&local_1a69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10e8,"If the address is watchonly.",&local_1a6a);
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_02._M_string_length = in_stack_ffffffffffffe280;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_02.field_2 = in_stack_ffffffffffffe288;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(local_fe8 + 3,BOOL,m_key_name_02,description_02,inner_02,SUB81(local_10c8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1108,"solvable",&local_1a89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1128,
             "If we know how to spend coins sent to this address, ignoring the possible lack of private keys."
             ,&local_1a8a);
  local_1aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe258;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_03._M_string_length = in_stack_ffffffffffffe280;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_03.field_2 = in_stack_ffffffffffffe288;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(&local_dc8,BOOL,m_key_name_03,description_03,inner_03,SUB81(local_1108,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1148,"desc",&local_1aa9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1168,"A descriptor for spending coins sent to this address (only when solvable)."
             ,&local_1aaa);
  local_1ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffe260;
  auVar1._0_4_ = in_stack_ffffffffffffe25c;
  auVar1._12_8_ = in_stack_ffffffffffffe268;
  auVar1._20_8_ = in_stack_ffffffffffffe270;
  auVar1._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe280;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_04.field_2 = in_stack_ffffffffffffe288;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_d40,STR,(string)(auVar1 << 0x20),SUB81(local_1148,0),description_04,inner_04,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1188,"parent_desc",&local_1ac9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11a8,"The descriptor used to derive this address if this is a descriptor wallet",
             &local_1aca);
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_stack_ffffffffffffe260;
  auVar2._0_4_ = in_stack_ffffffffffffe25c;
  auVar2._12_8_ = in_stack_ffffffffffffe268;
  auVar2._20_8_ = in_stack_ffffffffffffe270;
  auVar2._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe280;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_05.field_2 = in_stack_ffffffffffffe288;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_cb8,STR,(string)(auVar2 << 0x20),SUB81(local_1188,0),description_05,inner_05,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"isscript",&local_1ae9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11e8,"If the key is a script.",&local_1aea);
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffe260;
  auVar3._0_4_ = in_stack_ffffffffffffe25c;
  auVar3._12_8_ = in_stack_ffffffffffffe268;
  auVar3._20_8_ = in_stack_ffffffffffffe270;
  auVar3._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe280;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_06.field_2 = in_stack_ffffffffffffe288;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_c30,BOOL,(string)(auVar3 << 0x20),SUB81(local_11c8,0),description_06,inner_06,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1208,"ischange",&local_1b09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1228,"If the address was used for change output.",&local_1b0a);
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_07._M_string_length = in_stack_ffffffffffffe280;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_07.field_2 = in_stack_ffffffffffffe288;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(&local_ba8,BOOL,m_key_name_04,description_07,inner_07,SUB81(local_1208,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1248,"iswitness",&local_1b29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1268,"If the address is a witness address.",&local_1b2a);
  local_1b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_08._M_string_length = in_stack_ffffffffffffe280;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_08.field_2 = in_stack_ffffffffffffe288;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(&local_b20,BOOL,m_key_name_05,description_08,inner_08,SUB81(local_1248,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1288,"witness_version",&local_1b49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12a8,"The version number of the witness program.",&local_1b4a);
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_stack_ffffffffffffe260;
  auVar4._0_4_ = in_stack_ffffffffffffe25c;
  auVar4._12_8_ = in_stack_ffffffffffffe268;
  auVar4._20_8_ = in_stack_ffffffffffffe270;
  auVar4._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffe280;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_09.field_2 = in_stack_ffffffffffffe288;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_a98,NUM,(string)(auVar4 << 0x20),SUB81(local_1288,0),description_09,inner_09,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_12c8,"witness_program",&local_1b69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12e8,"The hex value of the witness program.",&local_1b6a);
  local_1b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_8_ = in_stack_ffffffffffffe260;
  auVar5._0_4_ = in_stack_ffffffffffffe25c;
  auVar5._12_8_ = in_stack_ffffffffffffe268;
  auVar5._20_8_ = in_stack_ffffffffffffe270;
  auVar5._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe280;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_10.field_2 = in_stack_ffffffffffffe288;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_a10,STR_HEX,(string)(auVar5 << 0x20),SUB81(local_12c8,0),description_10,inner_10
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1308,"script",&local_1b89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1328,
             "The output script type. Only if isscript is true and the redeemscript is known. Possible\ntypes: nonstandard, pubkey, pubkeyhash, scripthash, multisig, nulldata, witness_v0_keyhash,\nwitness_v0_scripthash, witness_unknown."
             ,&local_1b8a);
  local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_8_ = in_stack_ffffffffffffe260;
  auVar6._0_4_ = in_stack_ffffffffffffe25c;
  auVar6._12_8_ = in_stack_ffffffffffffe268;
  auVar6._20_8_ = in_stack_ffffffffffffe270;
  auVar6._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffe280;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_11.field_2 = in_stack_ffffffffffffe288;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_988,STR,(string)(auVar6 << 0x20),SUB81(local_1308,0),description_11,inner_11,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1348,"hex",&local_1ba9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1368,"The redeemscript for the p2sh address.",&local_1baa);
  local_1bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar7._4_8_ = in_stack_ffffffffffffe260;
  auVar7._0_4_ = in_stack_ffffffffffffe25c;
  auVar7._12_8_ = in_stack_ffffffffffffe268;
  auVar7._20_8_ = in_stack_ffffffffffffe270;
  auVar7._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe280;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_12.field_2 = in_stack_ffffffffffffe288;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_900,STR_HEX,(string)(auVar7 << 0x20),SUB81(local_1348,0),description_12,inner_12
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1388,"pubkeys",&local_1bc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13a8,
             "Array of pubkeys associated with the known redeemscript (only if script is multisig)."
             ,&local_1bca);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,"pubkey",&local_1be9);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,"",&local_1bea);
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_13._M_string_length = in_stack_ffffffffffffe280;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_13.field_2 = in_stack_ffffffffffffe288;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult(&local_1430,STR,m_key_name_06,description_13,inner_13,SUB81(local_1450,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1430;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1be8,__l_00,&local_1c09);
  auVar8._4_8_ = in_stack_ffffffffffffe260;
  auVar8._0_4_ = in_stack_ffffffffffffe25c;
  auVar8._12_8_ = in_stack_ffffffffffffe268;
  auVar8._20_8_ = in_stack_ffffffffffffe270;
  auVar8._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffe280;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_14.field_2 = in_stack_ffffffffffffe288;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_878,ARR,(string)(auVar8 << 0x20),SUB81(local_1388,0),description_14,inner_14,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,"sigsrequired",&local_1c0a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_14b0,
             "The number of signatures required to spend multisig output (only if script is multisig)."
             ,&local_1c0b);
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar9._4_8_ = in_stack_ffffffffffffe260;
  auVar9._0_4_ = in_stack_ffffffffffffe25c;
  auVar9._12_8_ = in_stack_ffffffffffffe268;
  auVar9._20_8_ = in_stack_ffffffffffffe270;
  auVar9._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe280;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_15.field_2 = in_stack_ffffffffffffe288;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_7f0,NUM,(string)(auVar9 << 0x20),SUB81(local_1490,0),description_15,inner_15,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,"pubkey",&local_1c29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_14f0,
             "The hex value of the raw public key for single-key addresses (possibly embedded in P2SH or P2WSH)."
             ,&local_1c2a);
  local_1c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar10._4_8_ = in_stack_ffffffffffffe260;
  auVar10._0_4_ = in_stack_ffffffffffffe25c;
  auVar10._12_8_ = in_stack_ffffffffffffe268;
  auVar10._20_8_ = in_stack_ffffffffffffe270;
  auVar10._28_4_ = 0;
  description_16._M_string_length = in_stack_ffffffffffffe280;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_16.field_2 = in_stack_ffffffffffffe288;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_768,STR_HEX,(string)(auVar10 << 0x20),SUB81(local_14d0,0),description_16,
             inner_16,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,"embedded",&local_1c49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1530,
             "Information about the address embedded in P2SH or P2WSH, if relevant and known.",
             &local_1c4a);
  std::__cxx11::string::string<std::allocator<char>>(local_15d8,"",&local_1c69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_15f8,
             "Includes all getaddressinfo output fields for the embedded address, excluding metadata (timestamp, hdkeypath, hdseedid)\nand relation to the wallet (ismine, iswatchonly)."
             ,&local_1c6a);
  local_1c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_17._M_string_length = in_stack_ffffffffffffe280;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_17.field_2 = in_stack_ffffffffffffe288;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_15b8,ELISION,m_key_name_07,description_17,inner_17,SUB81(local_15d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_15b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1c68,__l_01,&local_1c89);
  auVar11._4_8_ = in_stack_ffffffffffffe260;
  auVar11._0_4_ = in_stack_ffffffffffffe25c;
  auVar11._12_8_ = in_stack_ffffffffffffe268;
  auVar11._20_8_ = in_stack_ffffffffffffe270;
  auVar11._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffe280;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_18.field_2 = in_stack_ffffffffffffe288;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_6e0,OBJ,(string)(auVar11 << 0x20),SUB81(local_1510,0),description_18,inner_18,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1618,"iscompressed",&local_1c8a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1638,"If the pubkey is compressed.",&local_1c8b);
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12._4_8_ = in_stack_ffffffffffffe260;
  auVar12._0_4_ = in_stack_ffffffffffffe25c;
  auVar12._12_8_ = in_stack_ffffffffffffe268;
  auVar12._20_8_ = in_stack_ffffffffffffe270;
  auVar12._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffe280;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_19.field_2 = in_stack_ffffffffffffe288;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_658,BOOL,(string)(auVar12 << 0x20),SUB81(local_1618,0),description_19,inner_19,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1658,"timestamp",&local_1ca9);
  std::operator+(&local_1698,"The creation time of the key, if available, expressed in ",
                 &UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1678,&local_1698,".");
  auVar13._4_8_ = in_stack_ffffffffffffe260;
  auVar13._0_4_ = in_stack_ffffffffffffe25c;
  auVar13._12_8_ = in_stack_ffffffffffffe268;
  auVar13._20_8_ = in_stack_ffffffffffffe270;
  auVar13._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffe280;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_20.field_2 = in_stack_ffffffffffffe288;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_5d0,NUM_TIME,(string)(auVar13 << 0x20),SUB81(local_1658,0),description_20,
             inner_20,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16b8,"hdkeypath",(allocator<char> *)&stack0xffffffffffffe337);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16d8,"The HD keypath, if the key is HD and available.",
             (allocator<char> *)&stack0xffffffffffffe336);
  auVar14._4_8_ = in_stack_ffffffffffffe260;
  auVar14._0_4_ = in_stack_ffffffffffffe25c;
  auVar14._12_8_ = in_stack_ffffffffffffe268;
  auVar14._20_8_ = in_stack_ffffffffffffe270;
  auVar14._28_4_ = 0;
  description_21._M_string_length = in_stack_ffffffffffffe280;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_21.field_2 = in_stack_ffffffffffffe288;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_548,STR,(string)(auVar14 << 0x20),SUB81(local_16b8,0),description_21,inner_21,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16f8,"hdseedid",(allocator<char> *)&stack0xffffffffffffe317);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1718,"The Hash160 of the HD seed.",(allocator<char> *)&stack0xffffffffffffe316);
  pRVar25 = (pointer)0x0;
  pRVar26 = (pointer)0x0;
  auVar15._4_8_ = in_stack_ffffffffffffe260;
  auVar15._0_4_ = in_stack_ffffffffffffe25c;
  auVar15._12_8_ = in_stack_ffffffffffffe268;
  auVar15._20_8_ = in_stack_ffffffffffffe270;
  auVar15._28_4_ = 0;
  description_22._M_string_length = in_stack_ffffffffffffe280;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_22.field_2 = in_stack_ffffffffffffe288;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_4c0,STR_HEX,(string)(auVar15 << 0x20),SUB81(local_16f8,0),description_22,
             inner_22,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1738,"hdmasterfingerprint",(allocator<char> *)&stack0xffffffffffffe2f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1758,"The fingerprint of the master key.",
             (allocator<char> *)&stack0xffffffffffffe2f6);
  pRVar22 = (pointer)0x0;
  pRVar23 = (pointer)0x0;
  pRVar24 = (pointer)0x0;
  uVar18 = 0;
  auVar16._4_8_ = in_stack_ffffffffffffe260;
  auVar16._0_4_ = in_stack_ffffffffffffe25c;
  auVar16._12_8_ = in_stack_ffffffffffffe268;
  auVar16._20_8_ = in_stack_ffffffffffffe270;
  auVar16._28_4_ = 0;
  description_23._M_string_length = in_stack_ffffffffffffe280;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_23.field_2 = in_stack_ffffffffffffe288;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2a0;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe298;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2a8;
  RPCResult::RPCResult
            (&local_438,STR_HEX,(string)(auVar16 << 0x20),SUB81(local_1738,0),description_23,
             inner_23,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1778,"labels",(allocator<char> *)&stack0xffffffffffffe2d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1798,
             "Array of labels associated with the address. Currently limited to one label but returned\nas an array to keep the API stable if multiple labels are enabled in the future."
             ,(allocator<char> *)&stack0xffffffffffffe2d6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1840,"label name",(allocator<char> *)&stack0xffffffffffffe2b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1860,"Label name (defaults to \"\").",(allocator<char> *)&stack0xffffffffffffe2b6
            );
  pRVar19 = (pointer)0x0;
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_24._M_string_length = in_stack_ffffffffffffe280;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_24.field_2 = in_stack_ffffffffffffe288;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1820,STR,m_key_name_08,description_24,inner_24,SUB81(local_1840,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_1820;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2b8,__l_02,
             (allocator_type *)&stack0xffffffffffffe297);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_25._M_string_length = in_stack_ffffffffffffe280;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_25.field_2._M_local_buf = in_stack_ffffffffffffe288._M_local_buf;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar20;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar19;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar21;
  RPCResult::RPCResult(&local_3b0,ARR,m_key_name_09,description_25,inner_25,SUB81(local_1778,0));
  __l_03._M_len = 0x18;
  __l_03._M_array = local_fe8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1a00,__l_03,(allocator_type *)&stack0xffffffffffffe296);
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe25c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe260;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe268;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffe270;
  description_26._M_string_length = in_stack_ffffffffffffe280;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe278;
  description_26.field_2 = in_stack_ffffffffffffe288;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar20;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar19;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar21;
  RPCResult::RPCResult(&local_2e8,OBJ,m_key_name_10,description_26,inner_26,SUB81(local_308,0));
  result._4_4_ = in_stack_ffffffffffffe25c;
  result.m_type = uVar18;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe260;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe268;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe270;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe278;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe280;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffe288;
  result._64_8_ = pRVar19;
  result.m_description._M_dataplus._M_p = (pointer)pRVar20;
  result.m_description._M_string_length = (size_type)pRVar21;
  result._88_24_ = in_stack_ffffffffffffe2b0;
  result.m_cond._8_16_ = in_stack_ffffffffffffe2c8;
  result.m_cond.field_2._8_8_ = pRVar22;
  RPCResults::RPCResults(&local_19e0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18e0,"getaddressinfo",(allocator<char> *)&stack0xffffffffffffe295);
  std::operator+(&local_1920,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_1900,&local_1920,"\"");
  HelpExampleCli(&local_18c0,&local_18e0,&local_1900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1960,"getaddressinfo",(allocator<char> *)&stack0xffffffffffffe294);
  std::operator+(&local_19a0,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_1980,&local_19a0,"\"");
  HelpExampleRpc(&local_1940,&local_1960,&local_1980);
  std::operator+(&local_18a0,&local_18c0,&local_1940);
  local_1880 = local_1870;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a0._M_dataplus._M_p == &local_18a0.field_2) {
    uStack_1868 = local_18a0.field_2._8_8_;
  }
  else {
    local_1880 = local_18a0._M_dataplus._M_p;
  }
  local_1878 = local_18a0._M_string_length;
  local_18a0._M_string_length = 0;
  local_18a0.field_2._M_local_buf[0] = '\0';
  description_27._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:574:9)>
       ::_M_invoke;
  description_27._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:574:9)>
                ::_M_manager;
  description_27.field_2 = in_stack_ffffffffffffe288;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar20;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar19;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar21;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar22;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2c8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe2c8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar23;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe2f0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar24;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar25;
  fun._M_invoker = (_Invoker_type)pRVar26;
  local_18a0._M_dataplus._M_p = (pointer)&local_18a0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffe260,&stack0xffffffffffffe268)),
             description_27,args,(RPCResults)in_stack_ffffffffffffe2b0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe268);
  std::__cxx11::string::~string((string *)&local_1880);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::__cxx11::string::~string((string *)&local_1940);
  std::__cxx11::string::~string((string *)&local_1980);
  std::__cxx11::string::~string((string *)&local_19a0);
  std::__cxx11::string::~string((string *)&local_1960);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::__cxx11::string::~string((string *)&local_1900);
  std::__cxx11::string::~string((string *)&local_1920);
  std::__cxx11::string::~string((string *)&local_18e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19e0.m_results);
  RPCResult::~RPCResult(&local_2e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a00);
  lVar17 = 0xc38;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_fe8[0].m_type + lVar17));
    lVar17 = lVar17 + -0x88;
  } while (lVar17 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2b8);
  RPCResult::~RPCResult(&local_1820);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe298);
  std::__cxx11::string::~string(local_1860);
  std::__cxx11::string::~string(local_1840);
  std::__cxx11::string::~string(local_1798);
  std::__cxx11::string::~string(local_1778);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2d8);
  std::__cxx11::string::~string(local_1758);
  std::__cxx11::string::~string(local_1738);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2f8);
  std::__cxx11::string::~string(local_1718);
  std::__cxx11::string::~string(local_16f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe318);
  std::__cxx11::string::~string(local_16d8);
  std::__cxx11::string::~string(local_16b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe338);
  std::__cxx11::string::~string((string *)&local_1678);
  std::__cxx11::string::~string((string *)&local_1698);
  std::__cxx11::string::~string(local_1658);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ca8);
  std::__cxx11::string::~string(local_1638);
  std::__cxx11::string::~string(local_1618);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c68);
  RPCResult::~RPCResult(&local_15b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c88);
  std::__cxx11::string::~string(local_15f8);
  std::__cxx11::string::~string(local_15d8);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1510);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c48);
  std::__cxx11::string::~string(local_14f0);
  std::__cxx11::string::~string(local_14d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c28);
  std::__cxx11::string::~string(local_14b0);
  std::__cxx11::string::~string(local_1490);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1be8);
  RPCResult::~RPCResult(&local_1430);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c08);
  std::__cxx11::string::~string(local_1470);
  std::__cxx11::string::~string(local_1450);
  std::__cxx11::string::~string(local_13a8);
  std::__cxx11::string::~string(local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1bc8);
  std::__cxx11::string::~string(local_1368);
  std::__cxx11::string::~string(local_1348);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ba8);
  std::__cxx11::string::~string(local_1328);
  std::__cxx11::string::~string(local_1308);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b88);
  std::__cxx11::string::~string(local_12e8);
  std::__cxx11::string::~string(local_12c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b68);
  std::__cxx11::string::~string(local_12a8);
  std::__cxx11::string::~string(local_1288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b48);
  std::__cxx11::string::~string(local_1268);
  std::__cxx11::string::~string(local_1248);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b28);
  std::__cxx11::string::~string(local_1228);
  std::__cxx11::string::~string(local_1208);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b08);
  std::__cxx11::string::~string(local_11e8);
  std::__cxx11::string::~string(local_11c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ae8);
  std::__cxx11::string::~string(local_11a8);
  std::__cxx11::string::~string(local_1188);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ac8);
  std::__cxx11::string::~string(local_1168);
  std::__cxx11::string::~string(local_1148);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1aa8);
  std::__cxx11::string::~string(local_1128);
  std::__cxx11::string::~string(local_1108);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a88);
  std::__cxx11::string::~string(local_10e8);
  std::__cxx11::string::~string(local_10c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a68);
  std::__cxx11::string::~string(local_10a8);
  std::__cxx11::string::~string(local_1088);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a48);
  std::__cxx11::string::~string(local_1068);
  std::__cxx11::string::~string(local_1048);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a28);
  std::__cxx11::string::~string((string *)local_1028);
  std::__cxx11::string::~string(local_1008);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_19c0);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_260);
  std::__cxx11::string::~string(local_218);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1f8._M_first);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getaddressinfo()
{
    return RPCHelpMan{"getaddressinfo",
                "\nReturn information about the given bitcoin address.\n"
                "Some of the information will only be present if the address is in the active wallet.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address for which to get information."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The bitcoin address validated."},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The hex-encoded output script generated by the address."},
                        {RPCResult::Type::BOOL, "ismine", "If the address is yours."},
                        {RPCResult::Type::BOOL, "iswatchonly", "If the address is watchonly."},
                        {RPCResult::Type::BOOL, "solvable", "If we know how to spend coins sent to this address, ignoring the possible lack of private keys."},
                        {RPCResult::Type::STR, "desc", /*optional=*/true, "A descriptor for spending coins sent to this address (only when solvable)."},
                        {RPCResult::Type::STR, "parent_desc", /*optional=*/true, "The descriptor used to derive this address if this is a descriptor wallet"},
                        {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script."},
                        {RPCResult::Type::BOOL, "ischange", "If the address was used for change output."},
                        {RPCResult::Type::BOOL, "iswitness", "If the address is a witness address."},
                        {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program."},
                        {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program."},
                        {RPCResult::Type::STR, "script", /*optional=*/true, "The output script type. Only if isscript is true and the redeemscript is known. Possible\n"
                                                                     "types: nonstandard, pubkey, pubkeyhash, scripthash, multisig, nulldata, witness_v0_keyhash,\n"
                            "witness_v0_scripthash, witness_unknown."},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The redeemscript for the p2sh address."},
                        {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "Array of pubkeys associated with the known redeemscript (only if script is multisig).",
                        {
                            {RPCResult::Type::STR, "pubkey", ""},
                        }},
                        {RPCResult::Type::NUM, "sigsrequired", /*optional=*/true, "The number of signatures required to spend multisig output (only if script is multisig)."},
                        {RPCResult::Type::STR_HEX, "pubkey", /*optional=*/true, "The hex value of the raw public key for single-key addresses (possibly embedded in P2SH or P2WSH)."},
                        {RPCResult::Type::OBJ, "embedded", /*optional=*/true, "Information about the address embedded in P2SH or P2WSH, if relevant and known.",
                        {
                            {RPCResult::Type::ELISION, "", "Includes all getaddressinfo output fields for the embedded address, excluding metadata (timestamp, hdkeypath, hdseedid)\n"
                            "and relation to the wallet (ismine, iswatchonly)."},
                        }},
                        {RPCResult::Type::BOOL, "iscompressed", /*optional=*/true, "If the pubkey is compressed."},
                        {RPCResult::Type::NUM_TIME, "timestamp", /*optional=*/true, "The creation time of the key, if available, expressed in " + UNIX_EPOCH_TIME + "."},
                        {RPCResult::Type::STR, "hdkeypath", /*optional=*/true, "The HD keypath, if the key is HD and available."},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "The Hash160 of the HD seed."},
                        {RPCResult::Type::STR_HEX, "hdmasterfingerprint", /*optional=*/true, "The fingerprint of the master key."},
                        {RPCResult::Type::ARR, "labels", "Array of labels associated with the address. Currently limited to one label but returned\n"
                            "as an array to keep the API stable if multiple labels are enabled in the future.",
                        {
                            {RPCResult::Type::STR, "label name", "Label name (defaults to \"\")."},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
                    HelpExampleRpc("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::string error_msg;
    CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg);

    // Make sure the destination is valid
    if (!IsValidDestination(dest)) {
        // Set generic error message in case 'DecodeDestination' didn't set it
        if (error_msg.empty()) error_msg = "Invalid address";

        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error_msg);
    }

    UniValue ret(UniValue::VOBJ);

    std::string currentAddress = EncodeDestination(dest);
    ret.pushKV("address", currentAddress);

    CScript scriptPubKey = GetScriptForDestination(dest);
    ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

    std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);

    isminetype mine = pwallet->IsMine(dest);
    ret.pushKV("ismine", bool(mine & ISMINE_SPENDABLE));

    if (provider) {
        auto inferred = InferDescriptor(scriptPubKey, *provider);
        bool solvable = inferred->IsSolvable();
        ret.pushKV("solvable", solvable);
        if (solvable) {
            ret.pushKV("desc", inferred->ToString());
        }
    } else {
        ret.pushKV("solvable", false);
    }

    const auto& spk_mans = pwallet->GetScriptPubKeyMans(scriptPubKey);
    // In most cases there is only one matching ScriptPubKey manager and we can't resolve ambiguity in a better way
    ScriptPubKeyMan* spk_man{nullptr};
    if (spk_mans.size()) spk_man = *spk_mans.begin();

    DescriptorScriptPubKeyMan* desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (desc_spk_man) {
        std::string desc_str;
        if (desc_spk_man->GetDescriptorString(desc_str, /*priv=*/false)) {
            ret.pushKV("parent_desc", desc_str);
        }
    }

    ret.pushKV("iswatchonly", bool(mine & ISMINE_WATCH_ONLY));

    UniValue detail = DescribeWalletAddress(*pwallet, dest);
    ret.pushKVs(std::move(detail));

    ret.pushKV("ischange", ScriptIsChange(*pwallet, scriptPubKey));

    if (spk_man) {
        if (const std::unique_ptr<CKeyMetadata> meta = spk_man->GetMetadata(dest)) {
            ret.pushKV("timestamp", meta->nCreateTime);
            if (meta->has_key_origin) {
                // In legacy wallets hdkeypath has always used an apostrophe for
                // hardened derivation. Perhaps some external tool depends on that.
                ret.pushKV("hdkeypath", WriteHDKeypath(meta->key_origin.path, /*apostrophe=*/!desc_spk_man));
                ret.pushKV("hdseedid", meta->hd_seed_id.GetHex());
                ret.pushKV("hdmasterfingerprint", HexStr(meta->key_origin.fingerprint));
            }
        }
    }

    // Return a `labels` array containing the label associated with the address,
    // equivalent to the `label` field above. Currently only one label can be
    // associated with an address, but we return an array so the API remains
    // stable if we allow multiple labels to be associated with an address in
    // the future.
    UniValue labels(UniValue::VARR);
    const auto* address_book_entry = pwallet->FindAddressBookEntry(dest);
    if (address_book_entry) {
        labels.push_back(address_book_entry->GetLabel());
    }
    ret.pushKV("labels", std::move(labels));

    return ret;
},
    };
}